

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O3

SUNErrCode
SUNAdaptController_EstimateStep_Soderlind
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  double *pdVar1;
  void *pvVar2;
  double dVar3;
  sunrealtype sVar4;
  double dVar5;
  double dVar6;
  
  pdVar1 = (double *)C->content;
  if (*(int *)(pdVar1 + 10) < *(int *)((long)pdVar1 + 0x54)) {
    dVar3 = pow(dsm * pdVar1[5],-1.0 / (double)(p + 1));
    sVar4 = dVar3 * h;
  }
  else {
    dVar3 = (double)(p + 1);
    dVar5 = pow(dsm * pdVar1[5],-*pdVar1 / dVar3);
    *hnew = dVar5 * h;
    pvVar2 = C->content;
    if (*(int *)((long)pvVar2 + 0x54) < 1) {
      return 0;
    }
    dVar5 = *(double *)((long)pvVar2 + 0x40);
    dVar6 = pow(*(double *)((long)pvVar2 + 0x30),-*(double *)((long)pvVar2 + 8) / dVar3);
    dVar5 = pow(h / dVar5,*(double *)((long)C->content + 0x18));
    *hnew = dVar5 * dVar6 * *hnew;
    pvVar2 = C->content;
    if (*(int *)((long)pvVar2 + 0x54) < 2) {
      return 0;
    }
    dVar5 = *(double *)((long)pvVar2 + 0x40);
    dVar6 = *(double *)((long)pvVar2 + 0x48);
    dVar3 = pow(*(double *)((long)pvVar2 + 0x38),-*(double *)((long)pvVar2 + 0x10) / dVar3);
    dVar5 = pow(dVar5 / dVar6,*(double *)((long)C->content + 0x20));
    sVar4 = dVar5 * dVar3 * *hnew;
  }
  *hnew = sVar4;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_Soderlind(SUNAdaptController C,
                                                     sunrealtype h, int p,
                                                     sunrealtype dsm,
                                                     sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);

  /* order parameter to use */
  const int ord        = p + 1;
  const sunrealtype e1 = SODERLIND_BIAS(C) * dsm;

  /* Handle the case of insufficient history */
  if (SODERLIND_FIRSTSTEPS(C) < SODERLIND_HISTORYSIZE(C))
  {
    /* Fall back onto an I controller */
    *hnew = h * SUNRpowerR(e1, -SUN_RCONST(1.0) / ord);
    return SUN_SUCCESS;
  }

  const sunrealtype k1 = -SODERLIND_K1(C) / ord;
  *hnew                = h * SUNRpowerR(e1, k1);

  /* This branching is not ideal, but it's more efficient than computing extra
   * math operations with degenerate k values. */
  /* TODO(SBR): Consider making separate subclasses for I and PI controllers for
   * improved efficiency */
  if (SODERLIND_HISTORYSIZE(C) > 0)
  {
    const sunrealtype k2    = -SODERLIND_K2(C) / ord;
    const sunrealtype hrat1 = h / SODERLIND_HP(C);
    *hnew *= SUNRpowerR(SODERLIND_EP(C), k2) * SUNRpowerR(hrat1, SODERLIND_K4(C));

    if (SODERLIND_HISTORYSIZE(C) > 1)
    {
      const sunrealtype k3    = -SODERLIND_K3(C) / ord;
      const sunrealtype hrat2 = SODERLIND_HP(C) / SODERLIND_HPP(C);
      *hnew *= SUNRpowerR(SODERLIND_EPP(C), k3) *
               SUNRpowerR(hrat2, SODERLIND_K5(C));
    }
  }

  /* return with success */
  return SUN_SUCCESS;
}